

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O0

Cnf_Dat_t * Cnf_DeriveFastClauses(Aig_Man_t *p,int nOutputs)

{
  int iVar1;
  uint Entry_00;
  uint Entry_01;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Aig_Obj_t *pAVar3;
  Vec_Ptr_t *vLeaves_00;
  Vec_Ptr_t *vNodes_00;
  Vec_Int_t *vCover_00;
  Vec_Int_t *vClauses;
  Aig_Obj_t *pObj_00;
  Cnf_Dat_t *pCVar4;
  int **ppiVar5;
  int *piVar6;
  int DriLit;
  int OutLit;
  int Entry;
  int nVars;
  int k;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vCover;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vLeaves;
  Vec_Int_t *vTemp;
  Vec_Int_t *vMap;
  Vec_Int_t *vClas;
  Vec_Int_t *vLits;
  Cnf_Dat_t *pCnf;
  int nOutputs_local;
  Aig_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(0x10000);
  p_01 = Vec_IntAlloc(0x1000);
  iVar1 = Aig_ManObjNumMax(p);
  p_02 = Vec_IntStartFull(iVar1);
  OutLit = 1;
  if (nOutputs != 0) {
    iVar1 = Aig_ManRegNum(p);
    if (iVar1 == 0) {
      iVar1 = Aig_ManCoNum(p);
      if (nOutputs != iVar1) {
        __assert_fail("nOutputs == Aig_ManCoNum(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfFast.c"
                      ,0x234,"Cnf_Dat_t *Cnf_DeriveFastClauses(Aig_Man_t *, int)");
      }
      for (nVars = 0; iVar1 = Vec_PtrSize(p->vCos), nVars < iVar1; nVars = nVars + 1) {
        pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,nVars);
        iVar1 = Aig_ObjId(pAVar3);
        Vec_IntWriteEntry(p_02,iVar1,OutLit);
        OutLit = OutLit + 1;
      }
    }
    else {
      iVar1 = Aig_ManRegNum(p);
      if (nOutputs != iVar1) {
        __assert_fail("nOutputs == Aig_ManRegNum(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfFast.c"
                      ,0x23a,"Cnf_Dat_t *Cnf_DeriveFastClauses(Aig_Man_t *, int)");
      }
      iVar1 = Aig_ManCoNum(p);
      iVar2 = Aig_ManRegNum(p);
      for (nVars = iVar1 - iVar2; iVar1 = Vec_PtrSize(p->vCos), nVars < iVar1; nVars = nVars + 1) {
        pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,nVars);
        iVar1 = Aig_ObjId(pAVar3);
        Vec_IntWriteEntry(p_02,iVar1,OutLit);
        OutLit = OutLit + 1;
      }
    }
  }
  nVars = Vec_PtrSize(p->vObjs);
  while (nVars = nVars + -1, -1 < nVars) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,nVars);
    if (((pAVar3 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar3), iVar1 != 0)) &&
       ((*(ulong *)&pAVar3->field_0x18 >> 4 & 1) != 0)) {
      iVar1 = Aig_ObjId(pAVar3);
      Vec_IntWriteEntry(p_02,iVar1,OutLit);
      OutLit = OutLit + 1;
    }
  }
  for (nVars = 0; iVar1 = Vec_PtrSize(p->vCis), nVars < iVar1; nVars = nVars + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,nVars);
    iVar1 = Aig_ObjId(pAVar3);
    Vec_IntWriteEntry(p_02,iVar1,OutLit);
    OutLit = OutLit + 1;
  }
  pAVar3 = Aig_ManConst1(p);
  iVar1 = Aig_ObjId(pAVar3);
  Vec_IntWriteEntry(p_02,iVar1,OutLit);
  vLeaves_00 = Vec_PtrAlloc(100);
  vNodes_00 = Vec_PtrAlloc(100);
  vCover_00 = Vec_IntAlloc(0x10000);
  vClauses = Vec_IntAlloc(100);
  nVars = Vec_PtrSize(p->vObjs);
  while (nVars = nVars + -1, -1 < nVars) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,nVars);
    if (((pAVar3 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar3), iVar1 != 0)) &&
       ((*(ulong *)&pAVar3->field_0x18 >> 4 & 1) != 0)) {
      Cnf_ComputeClauses(p,pAVar3,vLeaves_00,vNodes_00,p_02,vCover_00,vClauses);
      for (Entry = 0; iVar1 = Vec_IntSize(vClauses), Entry < iVar1; Entry = Entry + 1) {
        iVar1 = Vec_IntEntry(vClauses,Entry);
        if (iVar1 == 0) {
          iVar1 = Vec_IntSize(p_00);
          Vec_IntPush(p_01,iVar1);
        }
        else {
          Vec_IntPush(p_00,iVar1);
        }
      }
    }
  }
  Vec_PtrFree(vLeaves_00);
  Vec_PtrFree(vNodes_00);
  Vec_IntFree(vCover_00);
  Vec_IntFree(vClauses);
  for (nVars = 0; iVar1 = Vec_PtrSize(p->vCos), nVars < iVar1; nVars = nVars + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,nVars);
    pObj_00 = Aig_ObjFanin0(pAVar3);
    iVar1 = Aig_ObjFaninC0(pAVar3);
    Entry_00 = Cnf_ObjGetLit(p_02,pObj_00,iVar1);
    iVar1 = Aig_ManCoNum(p);
    if (nVars < iVar1 - nOutputs) {
      iVar1 = Vec_IntSize(p_00);
      Vec_IntPush(p_01,iVar1);
      Vec_IntPush(p_00,Entry_00);
    }
    else {
      Entry_01 = Cnf_ObjGetLit(p_02,pAVar3,0);
      iVar1 = Vec_IntSize(p_00);
      Vec_IntPush(p_01,iVar1);
      Vec_IntPush(p_00,Entry_01);
      Vec_IntPush(p_00,Entry_00 ^ 1);
      iVar1 = Vec_IntSize(p_00);
      Vec_IntPush(p_01,iVar1);
      Vec_IntPush(p_00,Entry_01 ^ 1);
      Vec_IntPush(p_00,Entry_00);
    }
  }
  pAVar3 = Aig_ManConst1(p);
  iVar1 = Cnf_ObjGetLit(p_02,pAVar3,0);
  iVar2 = Vec_IntSize(p_00);
  Vec_IntPush(p_01,iVar2);
  Vec_IntPush(p_00,iVar1);
  pCVar4 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar4->pMan = p;
  pCVar4->nVars = OutLit + 1;
  iVar1 = Vec_IntSize(p_00);
  pCVar4->nLiterals = iVar1;
  iVar1 = Vec_IntSize(p_01);
  pCVar4->nClauses = iVar1;
  ppiVar5 = (int **)malloc((long)(pCVar4->nClauses + 1) << 3);
  pCVar4->pClauses = ppiVar5;
  piVar6 = Vec_IntReleaseArray(p_00);
  *pCVar4->pClauses = piVar6;
  for (nVars = 0; iVar1 = Vec_IntSize(p_01), nVars < iVar1; nVars = nVars + 1) {
    iVar1 = Vec_IntEntry(p_01,nVars);
    pCVar4->pClauses[nVars] = *pCVar4->pClauses + iVar1;
  }
  pCVar4->pClauses[pCVar4->nClauses] = *pCVar4->pClauses + pCVar4->nLiterals;
  piVar6 = Vec_IntReleaseArray(p_02);
  pCVar4->pVarNums = piVar6;
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  Vec_IntFree(p_02);
  return pCVar4;
}

Assistant:

Cnf_Dat_t * Cnf_DeriveFastClauses( Aig_Man_t * p, int nOutputs )
{
    Cnf_Dat_t * pCnf;
    Vec_Int_t * vLits, * vClas, * vMap, * vTemp;
    Vec_Ptr_t * vLeaves, * vNodes;
    Vec_Int_t * vCover;
    Aig_Obj_t * pObj;
    int i, k, nVars, Entry, OutLit, DriLit;

    vLits = Vec_IntAlloc( 1 << 16 );
    vClas = Vec_IntAlloc( 1 << 12 );
    vMap  = Vec_IntStartFull( Aig_ManObjNumMax(p) );

    // assign variables for the outputs
    nVars = 1;
    if ( nOutputs )
    {
        if ( Aig_ManRegNum(p) == 0 )
        {
            assert( nOutputs == Aig_ManCoNum(p) );
            Aig_ManForEachCo( p, pObj, i )
                Vec_IntWriteEntry( vMap, Aig_ObjId(pObj), nVars++ );
        }
        else
        {
            assert( nOutputs == Aig_ManRegNum(p) );
            Aig_ManForEachLiSeq( p, pObj, i )
                Vec_IntWriteEntry( vMap, Aig_ObjId(pObj), nVars++ );
        }
    }
    // assign variables to the internal nodes
    Aig_ManForEachNodeReverse( p, pObj, i )
        if ( pObj->fMarkA )
            Vec_IntWriteEntry( vMap, Aig_ObjId(pObj), nVars++ );
    // assign variables to the PIs and constant node
    Aig_ManForEachCi( p, pObj, i )
        Vec_IntWriteEntry( vMap, Aig_ObjId(pObj), nVars++ );
    Vec_IntWriteEntry( vMap, Aig_ObjId(Aig_ManConst1(p)), nVars++ );

    // create clauses
    vLeaves = Vec_PtrAlloc( 100 );
    vNodes  = Vec_PtrAlloc( 100 );
    vCover  = Vec_IntAlloc( 1 << 16 );
    vTemp   = Vec_IntAlloc( 100 );
    Aig_ManForEachNodeReverse( p, pObj, i )
    {
        if ( !pObj->fMarkA )
            continue;
        Cnf_ComputeClauses( p, pObj, vLeaves, vNodes, vMap, vCover, vTemp );
        Vec_IntForEachEntry( vTemp, Entry, k )
        {
            if ( Entry == 0 )
                Vec_IntPush( vClas, Vec_IntSize(vLits) );
            else
                Vec_IntPush( vLits, Entry );
        }       
    }
    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vCover );
    Vec_IntFree( vTemp );

    // create clauses for the outputs
    Aig_ManForEachCo( p, pObj, i )
    {
        DriLit = Cnf_ObjGetLit( vMap, Aig_ObjFanin0(pObj), Aig_ObjFaninC0(pObj) );
        if ( i < Aig_ManCoNum(p) - nOutputs )
        {
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPush( vLits, DriLit );
        }
        else
        {
            OutLit = Cnf_ObjGetLit( vMap, pObj, 0 );
            // first clause
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPush( vLits, OutLit );
            Vec_IntPush( vLits, DriLit ^ 1 );
            // second clause
            Vec_IntPush( vClas, Vec_IntSize(vLits) );
            Vec_IntPush( vLits, OutLit ^ 1 );
            Vec_IntPush( vLits, DriLit );
        }
    }
 
    // write the constant literal
    OutLit = Cnf_ObjGetLit( vMap, Aig_ManConst1(p), 0 );
    Vec_IntPush( vClas, Vec_IntSize(vLits) );
    Vec_IntPush( vLits, OutLit );

    // create structure
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->pMan = p;
    pCnf->nVars = nVars;
    pCnf->nLiterals = Vec_IntSize( vLits );
    pCnf->nClauses  = Vec_IntSize( vClas );
    pCnf->pClauses  = ABC_ALLOC( int *, pCnf->nClauses + 1 );
    pCnf->pClauses[0] = Vec_IntReleaseArray( vLits );
    Vec_IntForEachEntry( vClas, Entry, i )
        pCnf->pClauses[i] = pCnf->pClauses[0] + Entry;
    pCnf->pClauses[pCnf->nClauses] = pCnf->pClauses[0] + pCnf->nLiterals;
    pCnf->pVarNums  = Vec_IntReleaseArray( vMap );

    // cleanup
    Vec_IntFree( vLits );
    Vec_IntFree( vClas );
    Vec_IntFree( vMap );
    return pCnf;
}